

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall mjs::parser::check_literal(parser *this)

{
  token_type tt;
  bool bVar1;
  wchar_t *extraout_RDX;
  wchar_t *in_R9;
  wstring_view s;
  wstring_view message;
  wostringstream _oss;
  size_t local_1c8;
  source_extend *local_1c0;
  source_extend local_1a8;
  source_extend local_190 [15];
  
  tt = (this->current_token_).type_;
  bVar1 = is_literal(tt);
  if (!bVar1) {
    __assert_fail("is_literal(tt)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x1a7,"void mjs::parser::check_literal()");
  }
  if (this->strict_mode_ == true) {
    if (tt == string_literal) {
      current_extend(local_190,this);
      check_string_literal(this,local_190);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else if (tt == numeric_literal) {
      current_extend(local_190,this);
      s._M_len = ((local_190[0].file.
                   super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->text_).
                 _M_dataplus._M_p + local_190[0].start;
      s._M_str = extraout_RDX;
      bVar1 = is_octal_literal((mjs *)(ulong)(local_190[0].end - local_190[0].start),s);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_190[0].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if (bVar1) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_190);
        std::operator<<((wostream *)local_190,"Octal literals may not be used in strict mode");
        current_extend(&local_1a8,this);
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = local_1c8;
        syntax_error((parser *)"check_literal",(char *)0x1ac,(int)&local_1a8,local_1c0,message);
      }
    }
  }
  return;
}

Assistant:

void check_literal() {
        const auto tt = current_token_type();
        assert(is_literal(tt));
        if (!strict_mode_) {
            return;
        }
        if (tt == token_type::numeric_literal && is_octal_literal(current_extend().source_view())) {
            SYNTAX_ERROR("Octal literals may not be used in strict mode");
        } else if (tt == token_type::string_literal) {
            check_string_literal(current_extend());
        }
    }